

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O3

size_t andres::graph::
       labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
                 SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *mask,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       labeling)

{
  Value VVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pRVar5;
  pointer pRVar6;
  ulong uVar7;
  pointer pAVar8;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  size_t local_d0;
  unsigned_long local_c8;
  unsigned_long *local_c0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  Value local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_b8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_b8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  local_c0 = labeling._M_current;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_b8,
             (allocator_type *)&local_c8);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_b8,0);
  local_c8 = 0;
  pRVar5 = (graph->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (graph->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 == pRVar5) {
    local_d0 = 0;
  }
  else {
    local_d0 = 0;
    do {
      uVar7 = local_c8 + 0x3f;
      if (-1 < (long)local_c8) {
        uVar7 = local_c8;
      }
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((local_c8 & 0x800000000000003f) < 0x8000000000000001) - 1)
           ] >> (local_c8 & 0x3f) & 1) == 0) {
        local_c0[local_c8] = local_d0;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,&local_c8);
        }
        else {
          *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_c8;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        uVar7 = local_c8 + 0x3f;
        if (-1 < (long)local_c8) {
          uVar7 = local_c8;
        }
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar7 >> 6) + ((ulong)((local_c8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar7 >> 6) +
              ((ulong)((local_c8 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)local_c8 & 0x3f);
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pRVar5 = (graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          do {
            uVar7 = *local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
            if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
              local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
              local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
            pRVar5 = (graph->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar8 = pRVar5[uVar7].vector_.
                     super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pAVar8 != pRVar5[uVar7].vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                VVar1 = pAVar8->edge_;
                if (((mask->edgeLabels_->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start[VVar1] == '\0') &&
                   (pEVar2 = (mask->problem_->edges).
                             super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                   pEVar2[VVar1].t0 == pEVar2[VVar1].t1)) {
                  uVar3 = pAVar8->vertex_;
                  uVar4 = uVar3 + 0x3f;
                  if (-1 < (long)uVar3) {
                    uVar4 = uVar3;
                  }
                  if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar4 >> 6) +
                        ((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar3 & 0x3f) & 1) == 0) {
                    local_c0[uVar3] = local_d0;
                    local_60 = pAVar8->vertex_;
                    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                    emplace_back<unsigned_long>
                              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
                               &local_60);
                    uVar3 = pAVar8->vertex_;
                    uVar4 = uVar3 + 0x3f;
                    if (-1 < (long)uVar3) {
                      uVar4 = uVar3;
                    }
                    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar4 >> 6) +
                     ((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar4 >> 6) +
                          ((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                         1L << ((byte)uVar3 & 0x3f);
                    pRVar5 = (graph->vertices_).
                             super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  }
                }
                pAVar8 = pAVar8 + 1;
              } while (pAVar8 != pRVar5[uVar7].vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
            }
          } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
        }
        local_d0 = local_d0 + 1;
        pRVar6 = (graph->vertices_).
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 < (ulong)((long)pRVar6 - (long)pRVar5 >> 5));
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_b8);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return local_d0;
}

Assistant:

std::size_t
labelComponents(
    const GRAPH& graph,
    const SUBGRAPH_MASK& mask,
    ITERATOR labeling
) {
    std::size_t label = 0;
    std::vector<bool> visited(graph.numberOfVertices(), false);
    std::queue<std::size_t> queue;
    for(std::size_t v = 0; v < graph.numberOfVertices(); ++v) {
        if(mask.vertex(v)) {
            if(!visited[v]) {
                labeling[v] = label; // label
                queue.push(v);
                visited[v] = true;
                while(!queue.empty()) {
                    std::size_t w = queue.front();
                    queue.pop();
                    for(typename GRAPH::AdjacencyIterator it = graph.adjacenciesFromVertexBegin(w);
                    it != graph.adjacenciesFromVertexEnd(w); ++it) {
                        if(mask.edge(it->edge()) 
                        && mask.vertex(it->vertex()) 
                        && !visited[it->vertex()]) {
                            labeling[it->vertex()] = label; // label
                            queue.push(it->vertex());
                            visited[it->vertex()] = true;
                        }
                    }
                }
                label++;
            }
        }
        else {
            labeling[v] = 0;
        }
    }
    return label;
}